

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O0

void __thiscall CMU462::Ray::Ray(Ray *this,Vector3D *o,Vector3D *d,int depth)

{
  double *pdVar1;
  double dVar2;
  Vector3D local_40;
  int local_24;
  Vector3D *pVStack_20;
  int depth_local;
  Vector3D *d_local;
  Vector3D *o_local;
  Ray *this_local;
  
  this->depth = (long)depth;
  local_24 = depth;
  pVStack_20 = d;
  d_local = o;
  o_local = (Vector3D *)this;
  Vector3D::Vector3D(&this->o,o);
  Vector3D::Vector3D(&this->d,pVStack_20);
  this->min_t = 0.0;
  dVar2 = std::numeric_limits<double>::infinity();
  this->max_t = dVar2;
  Vector3D::Vector3D(&this->inv_d);
  Vector3D::Vector3D(&local_40,1.0 / pVStack_20->x,1.0 / pVStack_20->y,1.0 / pVStack_20->z);
  (this->inv_d).x = local_40.x;
  (this->inv_d).y = local_40.y;
  (this->inv_d).z = local_40.z;
  this->sign[0] = (uint)((this->inv_d).x <= 0.0 && (this->inv_d).x != 0.0);
  pdVar1 = &(this->inv_d).y;
  this->sign[1] = (uint)(*pdVar1 <= 0.0 && *pdVar1 != 0.0);
  pdVar1 = &(this->inv_d).z;
  this->sign[2] = (uint)(*pdVar1 <= 0.0 && *pdVar1 != 0.0);
  return;
}

Assistant:

Ray(const Vector3D& o, const Vector3D& d, int depth = 0)
      : o(o), d(d), min_t(0.0), max_t(INF_D), depth(depth) {
        inv_d = Vector3D(1 / d.x, 1 / d.y, 1 / d.z);
        sign[0] = (inv_d.x < 0);
        sign[1] = (inv_d.y < 0);
        sign[2] = (inv_d.z < 0);
      }